

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

FunctionBody * __thiscall
Js::ParseableFunctionInfo::Parse
          (ParseableFunctionInfo *this,ScriptFunction **functionRef,bool isByteCodeDeserialization)

{
  undefined1 *puVar1;
  byte *pbVar2;
  undefined2 uVar3;
  ushort uVar4;
  uint uVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  Type TVar9;
  uint sourceIndex;
  SourceContextInfo *pSVar10;
  NestedArray *pNVar11;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  ScriptContext *pSVar12;
  ThreadContext *pTVar13;
  Type pSVar14;
  code *pcVar15;
  uint32 grfscr;
  char16_t *pcVar16;
  ParseNodeProg *pnode;
  AutoDynamicCodeReference func;
  bool bVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  HRESULT HVar22;
  undefined4 *puVar23;
  FunctionBody *pFVar24;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Utf8SourceInfo *pUVar25;
  LPCUTF8 pSrc;
  FunctionInfo *pFVar26;
  undefined4 extraout_var_02;
  ulong uVar27;
  ScopeInfo *parentScopeInfo;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 extraout_RAX;
  undefined8 uVar28;
  uint uVar29;
  uint uVar30;
  undefined4 uVar31;
  uint uVar32;
  int *unaff_R15;
  undefined7 uVar33;
  undefined1 local_c08 [8];
  char16 debugStringBuffer [42];
  undefined1 local_160 [8];
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  CompileScriptException se;
  uint nextFunctionId;
  ParseNodeProg *local_c0;
  ParseNodeProg *parseTree;
  AutoDynamicCodeReference dynamicFunctionReference;
  ParseableFunctionInfo *rootFunc;
  undefined1 auStack_98 [8];
  AutoRestoreFunctionInfo autoRestoreFunctionInfo;
  HRESULT local_6c;
  FunctionBody *pFStack_68;
  HRESULT hrParser;
  ulong local_60;
  ulong local_58;
  byte local_49;
  ulong local_48;
  Type local_3c;
  uint local_38;
  AutoHandledExceptionType local_32;
  bool local_31;
  AutoHandledExceptionType __autoHandledExceptionType;
  
  pFVar26 = (this->super_FunctionProxy).functionInfo.ptr;
  if ((ParseableFunctionInfo *)(pFVar26->functionBodyImpl).ptr != this) {
    unaff_R15 = &AssertCount;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar23 = 1;
    bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0x8f2,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                 "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar17) goto LAB_00761200;
    *puVar23 = 0;
    pFVar26 = (this->super_FunctionProxy).functionInfo.ptr;
    if (pFVar26 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar23 = 1;
      bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar17) goto LAB_00761200;
      *puVar23 = 0;
      pFVar26 = (this->super_FunctionProxy).functionInfo.ptr;
    }
  }
  if ((ParseableFunctionInfo *)(pFVar26->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar23 = 1;
    bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                 "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar17) goto LAB_00761200;
    *puVar23 = 0;
    pFVar26 = (this->super_FunctionProxy).functionInfo.ptr;
  }
  if ((pFVar26->attributes & DeferredParse) == None) {
    bVar17 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (!bVar17) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar23 = 1;
      bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar17) goto LAB_00761200;
      *puVar23 = 0;
    }
    bVar17 = IsFunctionParsed(this);
    if (!bVar17) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar23 = 1;
      bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x8f6,"(GetFunctionBody()->IsFunctionParsed())",
                                   "GetFunctionBody()->IsFunctionParsed()");
      if (!bVar17) goto LAB_00761200;
      *puVar23 = 0;
    }
  }
  else {
    autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
    autoRestoreFunctionInfo.funcBody =
         (FunctionBody *)InterpreterStackFrame::DelayDynamicInterpreterThunk;
    auStack_98 = (undefined1  [8])this;
    if (((this->super_FunctionProxy).field_0x45 & 2) == 0) {
      Utf8SourceInfo::StopTrackingDeferredFunction
                ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,pFVar26->functionId);
      pFVar24 = FunctionBody::NewFromParseableFunctionInfo(this);
      pSVar10 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->
                sourceContextInfo).ptr;
      autoRestoreFunctionInfo.pfi = &pFVar24->super_ParseableFunctionInfo;
      if ((pSVar10->dwHostSourceContext == 0xffffffffffffffff) ||
         ((pSVar10->isHostDynamicDocument & 1U) != 0)) {
        bVar17 = Phases::IsEnabled((Phases *)&DAT_015bc490,DeferParsePhase);
        if (bVar17) {
          uVar5 = (this->super_FunctionProxy).m_functionNumber;
          iVar19 = (*(this->super_FunctionProxy).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
          pNVar11 = (this->nestedArray).ptr;
          if (pNVar11 == (NestedArray *)0x0) {
            uVar27 = 0;
          }
          else {
            uVar27 = (ulong)pNVar11->nestedCount;
          }
          pUVar25 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
          pcVar16 = L"LdTrue";
          if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
            pcVar16 = L"LdFalse";
          }
          Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                        ,(ulong)uVar5,CONCAT44(extraout_var_01,iVar19),(ulong)this->m_cchLength,
                        uVar27,(ulong)pUVar25->m_sourceInfoId,(ulong)pUVar25->m_cchLength,
                        pcVar16 + 2);
          goto LAB_00760421;
        }
      }
      else {
        bVar17 = Phases::IsEnabled((Phases *)&DAT_015bc490,DeferParsePhase);
        if (bVar17) {
          uVar5 = (this->super_FunctionProxy).m_functionNumber;
          iVar19 = (*(this->super_FunctionProxy).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
          pNVar11 = (this->nestedArray).ptr;
          if (pNVar11 == (NestedArray *)0x0) {
            uVar27 = 0;
          }
          else {
            uVar27 = (ulong)pNVar11->nestedCount;
          }
          pUVar25 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
          pcVar16 = L"LdTrue";
          if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
            pcVar16 = L"LdFalse";
          }
          Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                        ,(ulong)uVar5,CONCAT44(extraout_var,iVar19),(ulong)this->m_cchLength,uVar27,
                        (ulong)pUVar25->m_sourceInfoId,(ulong)pUVar25->m_cchLength,pcVar16 + 2,
                        (((((pUVar25->m_srcInfo).ptr)->sourceContextInfo).ptr)->field_5).field_0.url
                       );
LAB_00760421:
          Output::Flush();
        }
      }
      if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
        pSVar10 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->
                  sourceContextInfo).ptr;
        uVar31 = 0;
        if ((pSVar10->dwHostSourceContext == 0xffffffffffffffff) ||
           ((pSVar10->isHostDynamicDocument & 1U) != 0)) goto LAB_007604f3;
        bVar17 = ScriptContext::DoUndeferGlobalFunctions
                           ((this->super_FunctionProxy).m_scriptContext);
        if (bVar17) {
          pUVar25 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
          bVar17 = ScriptContext::DoUndeferGlobalFunctions((pUVar25->m_scriptContext).ptr);
          if (bVar17) {
            if ((pUVar25->field_0xa8 & 1) == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar23 = 1;
              bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                           ,0x14e,"(m_deferredFunctionsInitialized)",
                                           "m_deferredFunctionsInitialized");
              if (!bVar17) goto LAB_00761200;
              *puVar23 = 0;
            }
            this_00 = (pUVar25->m_deferredFunctionsDictionary).ptr;
            if (this_00 !=
                (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
              (pUVar25->m_deferredFunctionsDictionary).ptr =
                   (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                    *)0x0;
              JsUtil::
              SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
              ::MapAndRemoveIf<Js::ParseableFunctionInfo::Parse(Js::ScriptFunction**,bool)::__0>
                        ((SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
                          *)this_00,(anon_class_8_1_8991fb9c)this);
            }
          }
        }
      }
      uVar31 = 0;
    }
    else {
      bVar17 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                         ((this->super_FunctionProxy).m_scriptContext);
      if (bVar17) {
        bVar17 = (((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8 & 4) == 0;
        uVar33 = (undefined7)((ulong)unaff_R15 >> 8);
      }
      else {
        bVar17 = false;
        uVar33 = 0;
      }
      uVar3 = *(undefined2 *)&(this->super_FunctionProxy).field_0x45;
      bVar18 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
      if (!bVar18) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar18) goto LAB_00761200;
        *puVar23 = 0;
      }
      auStack_98 = (undefined1  [8])0x0;
      autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
      pFVar24 = (FunctionBody *)this;
      if (bVar17 || ((byte)((ushort)uVar3 >> 9) & 1) != 0) {
        if (((((this->super_FunctionProxy).field_0x47 & 0x10) == 0) &&
            (bVar17 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                                ((this->super_FunctionProxy).m_scriptContext), !bVar17)) &&
           (((this->super_FunctionProxy).field_0x46 & 2) == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar23 = 1;
          bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                       ,0x955,
                                       "(funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode)"
                                       ,
                                       "funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode"
                                      );
          if (!bVar17) goto LAB_00761200;
          *puVar23 = 0;
        }
        iVar19 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[7])(this);
        FunctionProxy::GetDebugNumberSet(&this->super_FunctionProxy,(wchar (*) [42])local_c08);
        Output::Trace(DebuggerPhase,L"Full nested reparse of function: %s (%s)\n",
                      CONCAT44(extraout_var_00,iVar19),local_c08);
        if (this[1].super_FunctionProxy.functionInfo.ptr != (FunctionInfo *)0x0) {
          CleanupToReparse(this);
        }
        uVar31 = (undefined4)CONCAT71(uVar33,1);
      }
      else {
        uVar31 = 0;
      }
    }
LAB_007604f3:
    if ((pFVar24->byteCodeBlock).ptr == (ByteBlock *)0x0) {
      if ((pFVar24->field_0x179 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x968,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                     "!funcBody->HasExecutionDynamicProfileInfo()");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
      }
      local_6c = 0;
      LeaveScriptObject<true,_false,_false>::LeaveScriptObject
                ((LeaveScriptObject<true,_false,_false> *)local_160,
                 (this->super_FunctionProxy).m_scriptContext,&stack0xfffffffffffffff8);
      pSVar12 = (this->super_FunctionProxy).m_scriptContext;
      pTVar13 = pSVar12->threadContext;
      local_31 = pTVar13->reentrancySafeOrHandled;
      pTVar13->reentrancySafeOrHandled = true;
      pUVar25 = ScriptContext::GetSource
                          (pSVar12,(pFVar24->super_ParseableFunctionInfo).m_sourceIndex);
      local_60 = CONCAT44(local_60._4_4_,uVar31);
      local_49 = pUVar25->field_0xa8;
      local_58 = (ulong)this->m_cbStartOffset;
      local_3c = this->m_cchStartOffset;
      uVar5 = this->m_cbLength;
      pSrc = Utf8SourceInfo::GetSource
                       ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,
                        L"ParseableFunctionInfo::GetStartOfDocument");
      uVar21 = (pFVar24->super_ParseableFunctionInfo).m_grfscr;
      uVar20 = uVar21 | 0x800000;
      uVar4 = *(ushort *)&(pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
      uVar21 = uVar21 & 0xffffefff;
      uVar29 = uVar21 | 0x1800000;
      uVar21 = uVar21 | 0x800000;
      if ((uVar4 >> 0xc & 1) != 0) {
        uVar29 = uVar20;
        uVar21 = uVar20;
      }
      if ((uVar4 & 4) != 0) {
        uVar29 = uVar21;
      }
      local_48 = CONCAT44(local_48._4_4_,uVar29);
      local_38 = (uint)(byte)(pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
      pFVar26 = (pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      pFStack_68 = pFVar24;
      if (pFVar26 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x4ea,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
        pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      if ((FunctionBody *)(pFVar26->functionBodyImpl).ptr != pFStack_68) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x4eb,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                     "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
        pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      TVar6 = pFVar26->attributes;
      if ((FunctionBody *)(pFVar26->functionBodyImpl).ptr != pFStack_68) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x500,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                     "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
        pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      TVar7 = pFVar26->attributes;
      if ((FunctionBody *)(pFVar26->functionBodyImpl).ptr != pFStack_68) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x569,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                     "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
        pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      TVar8 = pFVar26->attributes;
      if ((FunctionBody *)(pFVar26->functionBodyImpl).ptr != pFStack_68) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x570,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                     "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
        pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      TVar9 = pFVar26->attributes;
      if ((FunctionBody *)(pFVar26->functionBodyImpl).ptr != pFStack_68) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x577,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                     "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
        pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      uVar20 = (local_38 & 0x20) << 0x15;
      uVar29 = (TVar6 & Async) << 9;
      uVar30 = (TVar7 & Generator) << 0xd;
      uVar32 = (TVar8 & ClassConstructor) << 0x13;
      uVar21 = (pFVar26->attributes & ClassMethod) << 0x13 | (TVar9 & BaseConstructorKind) << 9;
      grfscr = uVar21 | uVar32 | uVar30 | uVar29 | uVar20 | (uint)local_48 & 0x81ffbef7 | 0x4000;
      if ((char)local_60 == '\0') {
        grfscr = uVar21 | uVar32 | uVar30 | uVar29 | uVar20 | (uint)local_48 & 0x81ffffff;
      }
      AutoHandledExceptionType::AutoHandledExceptionType
                (&local_32,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      pFVar24 = pFStack_68;
      se.hasLineNumberInfo = false;
      se._81_7_ = 0;
      __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
      __leaveScriptObject._36_4_ = 0;
      se.super_ScriptException.ichMin = 0;
      se.super_ScriptException.ichLim = 0;
      se.super_ScriptException.ei.wCode = 0;
      se.super_ScriptException.ei.wReserved = 0;
      se.super_ScriptException.ei._4_4_ = 0;
      se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
      se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
      se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
      se.super_ScriptException.ei.dwHelpContext = 0;
      se.super_ScriptException.ei._36_4_ = 0;
      se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
      se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
      se.super_ScriptException.ei.scode = 0;
      se.super_ScriptException.ei._60_4_ = 0;
      se.line._0_1_ = 0;
      Parser::Parser((Parser *)local_c08,(this->super_FunctionProxy).m_scriptContext,
                     *(ushort *)
                      &(pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 8
                     & 1,(PageAllocator *)0x0,false,0xaa8);
      local_c0 = (ParseNodeProg *)0x0;
      pFVar26 = (pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar26 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        local_48 = 0;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
        pFVar26 = (pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      se.bstrLine._4_4_ = pFVar26->functionId;
      local_48 = 0;
      local_6c = Parser::ParseSourceWithOffset
                           ((Parser *)local_c08,&local_c0,pSrc,local_58,(ulong)uVar5,local_3c,
                            (bool)((local_49 & 2) >> 1),grfscr,
                            (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                            (LocalFunctionId *)((long)&se.bstrLine + 4),
                            (pFVar24->super_ParseableFunctionInfo).m_lineNumber,
                            (((((pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.
                                m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr,
                            &pFVar24->super_ParseableFunctionInfo);
      if (local_6c < 0) {
        HVar22 = MapDeferredReparseError
                           (&local_6c,
                            (CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
        local_48 = CONCAT44(extraout_var_04,HVar22);
        if (HVar22 == -0x7ff5ebe4) {
          local_48 = 0x800a141c;
        }
        else if ((-1 < HVar22) || (local_6c < 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar23 = 1;
          bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                       ,0x9d7,
                                       "(hrParseCodeGen == JSERR_AsmJsCompileError || (((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0)))"
                                       ,
                                       "Syntax errors should never be detected on deferred re-parse"
                                      );
          if (!bVar17) goto LAB_00761200;
          *puVar23 = 0;
        }
        local_58 = local_58 & 0xffffffff00000000;
      }
      else {
        bVar17 = Phases::IsEnabled((Phases *)&DAT_015b6718,ByteCodePhase);
        if (bVar17) {
          iVar19 = (*(pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject[7])(pFVar24);
          local_48 = 0;
          Output::Print(L"\nDeferred parse %s\n",CONCAT44(extraout_var_02,iVar19));
        }
        parseTree = (ParseNodeProg *)(this->super_FunctionProxy).m_scriptContext;
        JavascriptLibrary::BeginDynamicFunctionReferences
                  ((((Type)parseTree)->super_ScriptContextBase).javascriptLibrary);
        local_48 = 0;
        uVar27 = 0;
        if ((char)local_60 != '\0') {
          pSVar14 = (this->super_FunctionProxy).m_scriptContext;
          uVar27 = CONCAT71((int7)((ulong)pSVar14 >> 8),(pSVar14->config).NoNative);
        }
        local_60 = uVar27;
        dynamicFunctionReference.m_scriptContext =
             (ScriptContext *)FunctionProxy::GetParseableFunctionInfo((FunctionProxy *)pFVar24);
        pnode = local_c0;
        pSVar12 = (this->super_FunctionProxy).m_scriptContext;
        sourceIndex = (pFStack_68->super_ParseableFunctionInfo).m_sourceIndex;
        parentScopeInfo =
             (ScopeInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFStack_68,ScopeInfo);
        HVar22 = GenerateByteCode(pnode,grfscr,pSVar12,
                                  (ParseableFunctionInfo **)&dynamicFunctionReference,sourceIndex,
                                  (bool)(char)local_60,(Parser *)local_c08,
                                  (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                                  parentScopeInfo,functionRef);
        func = dynamicFunctionReference;
        local_48 = CONCAT44(extraout_var_03,HVar22);
        pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar26 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar23 = 1;
          bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                       ,0x553,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar17) goto LAB_00761200;
          *puVar23 = 0;
          pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        if ((FunctionBody *)(pFVar26->functionBodyImpl).ptr != pFStack_68) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar23 = 1;
          bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                       ,0x554,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                       "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar17) goto LAB_00761200;
          *puVar23 = 0;
          pFVar26 = (pFStack_68->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        FunctionInfo::SetParseableFunctionInfo
                  (pFVar26,(ParseableFunctionInfo *)func.m_scriptContext);
        if (-1 >= HVar22) {
          if (HVar22 != -0x7999bffc) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar23 = 1;
            bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                         ,0x9ec,"(hrParseCodeGen == ((HRESULT)0x86664004L))",
                                         "hrParseCodeGen == SCRIPT_E_RECORDED");
            if (!bVar17) goto LAB_00761200;
            *puVar23 = 0;
          }
          local_48 = (ulong)se.super_ScriptException.ei.pfnDeferredFillIn & 0xffffffff;
        }
        JavascriptLibrary::EndDynamicFunctionReferences
                  (*(JavascriptLibrary **)&(parseTree->super_ParseNodeFnc).super_ParseNode.ichLim);
        local_58 = CONCAT44(local_58._4_4_,
                            (int)CONCAT71((int7)((ulong)func.m_scriptContext >> 8),-1 < HVar22));
      }
      Parser::~Parser((Parser *)local_c08);
      CompileScriptException::~CompileScriptException
                ((CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
      AutoHandledExceptionType::~AutoHandledExceptionType(&local_32);
      local_3c = (Type)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      local_60 = local_60 & 0xffffffff00000000;
      local_38 = 0;
      pSVar14 = (this->super_FunctionProxy).m_scriptContext;
      if (pSVar14 != (Type)0x0) {
        ThreadContext::DisposeOnLeaveScript(pSVar14->threadContext);
      }
      pTVar13->reentrancySafeOrHandled = local_31;
      LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
                ((LeaveScriptObject<true,_false,_false> *)local_160);
      pFVar24 = pFStack_68;
      if ((char)local_60 != '\0') {
        JavascriptError::ThrowOutOfMemoryError((this->super_FunctionProxy).m_scriptContext);
      }
      if ((char)local_38 == '\x01') {
        uVar28 = __cxa_allocate_exception(1);
        __cxa_throw(uVar28,&NotImplementedException::typeinfo,0);
      }
      if ((char)local_3c == '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x9f7,"(hr == 0L)","hr == NO_ERROR");
        if (!bVar17) goto LAB_00761200;
        *puVar23 = 0;
      }
      if (local_6c < 0) {
        JavascriptError::ThrowError
                  ((this->super_FunctionProxy).m_scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
      }
      iVar19 = (int)local_48;
      if (iVar19 < 0) {
        if (iVar19 != -0x7ff5ebe4) {
          if (iVar19 != -0x7ff5ffe4) {
            JavascriptError::MapAndThrowError((this->super_FunctionProxy).m_scriptContext,iVar19);
          }
          JavascriptError::ThrowStackOverflowError
                    ((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
        }
        AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)auStack_98);
        if ((char)local_58 == '\0') goto LAB_00760f8e;
      }
      else {
        auStack_98 = (undefined1  [8])0x0;
        autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
        AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)auStack_98);
        if ((char)local_58 == '\0') goto LAB_00760513;
      }
      *(ushort *)&(pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
           *(ushort *)&(pFVar24->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
           0xffbf | *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x40;
      puVar1 = &(this->super_FunctionProxy).field_0x45;
      *puVar1 = *puVar1 | 2;
      if (-1 < (int)(uint)local_48) {
        return pFVar24;
      }
LAB_00760f8e:
      pbVar2 = (byte *)((long)&this->m_grfscr + 1);
      *pbVar2 = *pbVar2 | 0x40;
      pFVar24 = Parse(this,functionRef,isByteCodeDeserialization);
      return pFVar24;
    }
    auStack_98 = (undefined1  [8])0x0;
    autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
    AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)auStack_98);
  }
LAB_00760513:
  bVar17 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (!bVar17) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar23 = 1;
    bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar17) {
LAB_00761200:
      pcVar15 = (code *)invalidInstructionException();
      (*pcVar15)();
    }
    *puVar23 = 0;
  }
  return (FunctionBody *)this;
}

Assistant:

FunctionBody* ParseableFunctionInfo::Parse(ScriptFunction ** functionRef, bool isByteCodeDeserialization)
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        if (!IsDeferredParseFunction())
        {
            // If not deferredparsed, the functionBodyImpl and this will be the same, just return the current functionBody.
            Assert(GetFunctionBody()->IsFunctionParsed());
            return GetFunctionBody();
        }

        bool asmjsParseFailed = false;
        BOOL fParsed = FALSE;
        FunctionBody* returnFunctionBody = nullptr;

        bool isDebugOrAsmJsReparse = false;
        FunctionBody* funcBody = nullptr;

        {
            AutoRestoreFunctionInfo autoRestoreFunctionInfo(this, DefaultEntryThunk);


            // If m_hasBeenParsed = true, one of the following things happened things happened:
            // - We had multiple function objects which were all defer-parsed, but with the same function body and one of them
            //   got the body to be parsed before another was called
            // - We are in debug mode and had our thunks switched to DeferParseThunk
            // - This is an already parsed asm.js module, which has been invalidated at link time and must be reparsed as a non-asm.js function
            if (!this->m_hasBeenParsed)
            {
                this->GetUtf8SourceInfo()->StopTrackingDeferredFunction(this->GetLocalFunctionId());
                funcBody = FunctionBody::NewFromParseableFunctionInfo(this);
                autoRestoreFunctionInfo.funcBody = funcBody;

                PERF_COUNTER_DEC(Code, DeferredFunction);

                if (!this->GetSourceContextInfo()->IsDynamic())
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
                }
                else
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(),  this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
                }

                if (!this->GetIsTopLevel() &&
                    !this->GetSourceContextInfo()->IsDynamic() &&
                    this->m_scriptContext->DoUndeferGlobalFunctions())
                {
                    this->GetUtf8SourceInfo()->UndeferGlobalFunctions([this](const Utf8SourceInfo::DeferredFunctionsDictionary::EntryType& func)
                    {
                        Js::ParseableFunctionInfo *nextFunc = func.Value();
                        JavascriptExceptionObject* pExceptionObject = nullptr;

                        if (nextFunc != nullptr && this != nextFunc)
                        {
                            try
                            {
                                nextFunc->Parse();
                            }
                            catch (OutOfMemoryException) {}
                            catch (StackOverflowException) {}
                            catch (const Js::JavascriptException& err)
                            {
                                pExceptionObject = err.GetAndClear();
                            }

                            // Do not do anything with an OOM or SOE, returning true is fine, it will then be undeferred (or attempted to again when called)
                            if (pExceptionObject)
                            {
                                if (pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingOOMErrorObject() &&
                                    pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingSOErrorObject())
                                {
                                    JavascriptExceptionOperators::DoThrow(pExceptionObject, /*scriptContext*/nullptr);
                                }
                            }
                        }

                        return true;
                    });
                }
            }
            else
            {
                bool isDebugReparse = m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() && !this->GetUtf8SourceInfo()->GetIsLibraryCode();
                bool isAsmJsReparse = m_isAsmjsMode && !isDebugReparse;

                isDebugOrAsmJsReparse = isAsmJsReparse || isDebugReparse;

                funcBody = this->GetFunctionBody();

                // As we have a valid function body already clear the restore data
                autoRestoreFunctionInfo.Clear();

                if (isDebugOrAsmJsReparse)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
#if DBG
                    Assert(
                        funcBody->IsReparsed()
                        || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode()
                        || m_isAsmjsMode);
#endif
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("Full nested reparse of function: %s (%s)\n"), funcBody->GetDisplayName(), funcBody->GetDebugNumberSet(debugStringBuffer));

                    if (funcBody->GetByteCode())
                    {
                        // The current function needs to be cleaned up before getting generated in the debug mode.
                        funcBody->CleanupToReparse();
                    }

                }
            }

            // Note that we may be trying to re-gen an already-completed function. (This can happen, for instance,
            // in the case of named function expressions inside "with" statements in compat mode.)
            // In such a case, there's no work to do.
            if (funcBody->GetByteCode() == nullptr)
            {
#if ENABLE_PROFILE_INFO
                Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif
                // In debug or asm.js mode, the scriptlet will be asked to recompile again.

                HRESULT hr = NO_ERROR;
                HRESULT hrParser = NO_ERROR;
                HRESULT hrParseCodeGen = NO_ERROR;

                BEGIN_LEAVE_SCRIPT_INTERNAL(m_scriptContext)
                {
                    bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

                    size_t offset = this->StartOffset();
                    charcount_t charOffset = this->StartInDocument();
                    size_t length = this->LengthInBytes();

                    LPCUTF8 pszStart = this->GetStartOfDocument();

                    uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc;

                    // For the global function we want to re-use the glo functionbody which is already created in the non-debug mode
                    if (!funcBody->GetIsGlobalFunc())
                    {
                        grfscr &= ~fscrGlobalCode;
                    }

                    if (!funcBody->GetIsDeclaration() && !funcBody->GetIsGlobalFunc()) // No refresh may reparse global function (e.g. eval code)
                    {
                        // Notify the parser that the top-level function was defined in an expression,
                        // (not a function declaration statement).
                        grfscr |= fscrDeferredFncExpression;
                    }

                    if (funcBody->IsMethod())
                    {
                        grfscr |= fscrDeferredFncIsMethod;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsMethod;
                    }

                    if (funcBody->IsAsync())
                    {
                        grfscr |= fscrDeferredFncIsAsync;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsAsync;
                    }

                    if (funcBody->IsGenerator())
                    {
                        grfscr |= fscrDeferredFncIsGenerator;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsGenerator;
                    }

                    if (funcBody->IsClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassConstructor;
                    }

                    if (funcBody->IsBaseClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsBaseClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsBaseClassConstructor;
                    }

                    if (funcBody->IsClassMethod())
                    {
                        grfscr |= fscrDeferredFncIsClassMember;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassMember;
                    }

                    if (isDebugOrAsmJsReparse)
                    {
                        // Disable deferred parsing if not DeferNested, or doing a debug/asm.js re-parse
                        // Disable asm.js when debugging or if linking failed
                        // Disable parser state cache if we're debugging or reparsing asm.js
                        grfscr = fscrNoAsmJs | (grfscr & ~(fscrWillDeferFncParse | fscrCreateParserState));
                    }

                    BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT
                    {
                        CompileScriptException se;
                        Parser ps(m_scriptContext, funcBody->GetIsStrictMode() ? TRUE : FALSE);
                        ParseNodeProg * parseTree = nullptr;

                        uint nextFunctionId = funcBody->GetLocalFunctionId();
                        hrParser = ps.ParseSourceWithOffset(&parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, &se,
                            &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                            funcBody);
                        // Assert(FAILED(hrParser) || nextFunctionId == funcBody->deferredParseNextFunctionId || isDebugOrAsmJsReparse || isByteCodeDeserialization);

                        if (FAILED(hrParser))
                        {
                            hrParseCodeGen = MapDeferredReparseError(hrParser, se); // Map certain errors like OOM/SOE
                            AssertMsg(hrParseCodeGen == JSERR_AsmJsCompileError // AsmJsCompileError is not a syntax error
                                || (FAILED(hrParseCodeGen) && SUCCEEDED(hrParser)), "Syntax errors should never be detected on deferred re-parse");
                        }
                        else
                        {
                            TRACE_BYTECODE(_u("\nDeferred parse %s\n"), funcBody->GetDisplayName());
                            Js::AutoDynamicCodeReference dynamicFunctionReference(m_scriptContext);

                            bool forceNoNative = isDebugOrAsmJsReparse ? this->GetScriptContext()->IsInterpreted() : false;

                            ParseableFunctionInfo* rootFunc = funcBody->GetParseableFunctionInfo();
                            hrParseCodeGen = GenerateByteCode(parseTree, grfscr, m_scriptContext,
                                &rootFunc, funcBody->GetSourceIndex(),
                                forceNoNative, &ps, &se, funcBody->GetScopeInfo(), functionRef);
                            funcBody->SetParseableFunctionInfo(rootFunc);

                            if (SUCCEEDED(hrParseCodeGen))
                            {
                                fParsed = TRUE;
                            }
                            else
                            {
                                Assert(hrParseCodeGen == SCRIPT_E_RECORDED);
                                hrParseCodeGen = se.ei.scode;
                            }
                        }
                    }
                    END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
                }
                END_LEAVE_SCRIPT_INTERNAL(m_scriptContext);

                THROW_KNOWN_HRESULT_EXCEPTIONS(hr, m_scriptContext);

                Assert(hr == NO_ERROR);

                if (!SUCCEEDED(hrParser))
                {
                    JavascriptError::ThrowError(m_scriptContext, VBSERR_InternalError);
                }
                else if (!SUCCEEDED(hrParseCodeGen))
                {
                    /*
                     * VBSERR_OutOfStack is of type kjstError but we throw a (more specific) StackOverflowError when a hard stack
                     * overflow occurs. To keep the behavior consistent I'm special casing it here.
                     */
                    if (hrParseCodeGen == VBSERR_OutOfStack)
                    {
                        JavascriptError::ThrowStackOverflowError(m_scriptContext);
                    }
                    else if (hrParseCodeGen == JSERR_AsmJsCompileError)
                    {
                        asmjsParseFailed = true;
                    }
                    else
                    {
                        JavascriptError::MapAndThrowError(m_scriptContext, hrParseCodeGen);
                    }
                }
            }
            else
            {
                fParsed = FALSE;
            }